

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_UnknownFieldPartialEqualTest_Test::TestBody
          (MessageDifferencerTest_UnknownFieldPartialEqualTest_Test *this)

{
  bool bVar1;
  UnknownFieldSet *pUVar2;
  UnknownField *pUVar3;
  char *message;
  char *in_R9;
  string local_278;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  string_view local_70;
  UnknownFieldSet *local_60;
  UnknownFieldSet *unknown2;
  UnknownFieldSet *unknown1;
  undefined1 local_40 [8];
  TestEmptyMessage empty2;
  TestEmptyMessage empty1;
  MessageDifferencerTest_UnknownFieldPartialEqualTest_Test *this_local;
  
  proto2_unittest::TestEmptyMessage::TestEmptyMessage
            ((TestEmptyMessage *)&empty2.super_ZeroFieldsBase._impl_);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage((TestEmptyMessage *)local_40);
  unknown2 = proto2_unittest::TestEmptyMessage::mutable_unknown_fields
                       ((TestEmptyMessage *)&empty2.super_ZeroFieldsBase._impl_);
  local_60 = proto2_unittest::TestEmptyMessage::mutable_unknown_fields((TestEmptyMessage *)local_40)
  ;
  UnknownFieldSet::AddVarint(unknown2,0xf3,0x7a);
  pUVar2 = unknown2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"abc");
  UnknownFieldSet::AddLengthDelimited(pUVar2,0xf5,local_70);
  pUVar2 = UnknownFieldSet::AddGroup(unknown2,0xf6);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,1);
  pUVar3 = UnknownFieldSet::mutable_field(unknown2,2);
  pUVar2 = UnknownField::mutable_group(pUVar3);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,2);
  UnknownFieldSet::AddVarint(local_60,0xf3,0x7a);
  pUVar2 = local_60;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&differencer.unpack_any_field_,
             "abc");
  UnknownFieldSet::AddLengthDelimited(pUVar2,0xf5,stack0xffffffffffffff80);
  pUVar2 = UnknownFieldSet::AddGroup(local_60,0xf6);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,1);
  pUVar3 = UnknownFieldSet::mutable_field(local_60,2);
  pUVar2 = UnknownField::mutable_group(pUVar3);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,2);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar_.message_,PARTIAL);
  local_241 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)&gtest_ar_.message_,
                         (Message *)&empty2.super_ZeroFieldsBase._impl_,(Message *)local_40);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_240,&local_241,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_278,(internal *)local_240,
               (AssertionResult *)"differencer.Compare(empty1, empty2)","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x4da,message);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  proto2_unittest::TestEmptyMessage::~TestEmptyMessage((TestEmptyMessage *)local_40);
  proto2_unittest::TestEmptyMessage::~TestEmptyMessage
            ((TestEmptyMessage *)&empty2.super_ZeroFieldsBase._impl_);
  return;
}

Assistant:

TEST(MessageDifferencerTest, UnknownFieldPartialEqualTest) {
  unittest::TestEmptyMessage empty1;
  unittest::TestEmptyMessage empty2;

  UnknownFieldSet* unknown1 = empty1.mutable_unknown_fields();
  UnknownFieldSet* unknown2 = empty2.mutable_unknown_fields();

  unknown1->AddVarint(243, 122);
  unknown1->AddLengthDelimited(245, "abc");
  unknown1->AddGroup(246)->AddFixed32(248, 1);
  unknown1->mutable_field(2)->mutable_group()->AddFixed32(248, 2);

  unknown2->AddVarint(243, 122);
  unknown2->AddLengthDelimited(245, "abc");
  unknown2->AddGroup(246)->AddFixed32(248, 1);
  unknown2->mutable_field(2)->mutable_group()->AddFixed32(248, 2);

  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(empty1, empty2));
}